

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON_SubDEdge * __thiscall ON_SubDHeap::AllocateEdgeAndSetId(ON_SubDHeap *this,uint candidate_edge_id)

{
  ON_SubDEdge *pOVar1;
  ON_SubDComponentBase *unused_list;
  ON_SubDEdge *local_18;
  
  local_18 = this->m_unused_edge;
  pOVar1 = (ON_SubDEdge *)
           Internal_AllocateComponentAndSetId
                     (&this->m_fspe,(ON_SubDComponentBase **)&local_18,&this->m_max_edge_id,
                      candidate_edge_id);
  this->m_unused_edge = local_18;
  return pOVar1;
}

Assistant:

class ON_SubDEdge* ON_SubDHeap::AllocateEdgeAndSetId(
  unsigned int candidate_edge_id
  )
{
  ON_SubDComponentBase* unused_list = m_unused_edge;
  ON_SubDComponentBase* c = ON_SubDHeap::Internal_AllocateComponentAndSetId(
    m_fspe,
    unused_list,
    m_max_edge_id,
    candidate_edge_id
  );
  m_unused_edge = static_cast<ON_SubDEdge*>(unused_list);
  return static_cast<ON_SubDEdge*>(c);
}